

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TexSubImageCubeAlignCase::createTexture(TexSubImageCubeAlignCase *this)

{
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 type;
  int iVar4;
  int height;
  int iVar5;
  int iVar6;
  reference pvVar7;
  int local_ec;
  int face_1;
  Vector<float,_4> local_d8;
  PixelBufferAccess local_c8;
  int local_a0;
  int local_9c;
  int rowPitch;
  int face;
  Vector<float,_4> local_88;
  PixelBufferAccess local_78;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  deUint32 tex;
  TexSubImageCubeAlignCase *this_local;
  
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             (deUint32 *)
             ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  sglr::ContextWrapper::glBindTexture
            (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,0x8513,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_);
  iVar5 = tcu::TextureFormat::getPixelSize(&(this->super_TextureCubeSpecCase).m_texFormat);
  iVar6 = (this->super_TextureCubeSpecCase).m_size;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,
             (long)(iVar5 * iVar6 * iVar6));
  iVar6 = (this->super_TextureCubeSpecCase).m_size;
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_78,&(this->super_TextureCubeSpecCase).m_texFormat,iVar6,iVar6,1,pvVar7);
  tcu::Vector<float,_4>::Vector(&local_88,0.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&rowPitch,1.0);
  tcu::fillWithComponentGradients(&local_78,&local_88,(Vec4 *)&rowPitch);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf5,1);
  for (local_9c = 0; local_9c < 6; local_9c = local_9c + 1) {
    dVar1 = *(deUint32 *)(s_cubeMapFaces + (long)local_9c * 4);
    iVar6 = (this->super_TextureCubeSpecCase).m_size;
    dVar2 = this->m_internalFormat;
    dVar3 = this->m_format;
    type = this->m_dataType;
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
    sglr::ContextWrapper::glTexImage2D
              (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,dVar1,0
               ,dVar2,iVar6,iVar6,0,dVar3,type,pvVar7);
  }
  iVar6 = tcu::TextureFormat::getPixelSize(&(this->super_TextureCubeSpecCase).m_texFormat);
  local_a0 = deAlign32(iVar6 * this->m_subW,this->m_alignment);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,
             (long)(local_a0 * this->m_subH));
  iVar4 = local_a0;
  iVar6 = this->m_subW;
  iVar5 = this->m_subH;
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_c8,&(this->super_TextureCubeSpecCase).m_texFormat,iVar6,iVar5,1,iVar4,0,pvVar7);
  tcu::Vector<float,_4>::Vector(&local_d8,1.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xffffffffffffff18,0.0,1.0,0.0,1.0);
  tcu::fillWithGrid(&local_c8,4,&local_d8,(Vec4 *)&stack0xffffffffffffff18);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf5,
             this->m_alignment);
  for (local_ec = 0; local_ec < 6; local_ec = local_ec + 1) {
    dVar1 = *(deUint32 *)(s_cubeMapFaces + (long)local_ec * 4);
    iVar6 = this->m_subX;
    iVar5 = this->m_subY;
    iVar4 = this->m_subW;
    height = this->m_subH;
    dVar2 = this->m_format;
    dVar3 = this->m_dataType;
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
    sglr::ContextWrapper::glTexSubImage2D
              (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,dVar1,0
               ,iVar6,iVar5,iVar4,height,dVar2,dVar3,pvVar7);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32			tex			= 0;
		vector<deUint8>		data;

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);

		// Specify base level.
		data.resize(m_texFormat.getPixelSize()*m_size*m_size);
		tcu::fillWithComponentGradients(tcu::PixelBufferAccess(m_texFormat, m_size, m_size, 1, &data[0]), Vec4(0.0f), Vec4(1.0f));

		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
			glTexImage2D(s_cubeMapFaces[face], 0, m_internalFormat, m_size, m_size, 0, m_format, m_dataType, &data[0]);

		// Re-specify subrectangle.
		int rowPitch = deAlign32(m_texFormat.getPixelSize()*m_subW, m_alignment);
		data.resize(rowPitch*m_subH);
		tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, m_subW, m_subH, 1, rowPitch, 0, &data[0]), 4, Vec4(1.0f, 0.0f, 0.0f, 1.0f), Vec4(0.0f, 1.0f, 0.0f, 1.0f));

		glPixelStorei(GL_UNPACK_ALIGNMENT, m_alignment);
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
			glTexSubImage2D(s_cubeMapFaces[face], 0, m_subX, m_subY, m_subW, m_subH, m_format, m_dataType, &data[0]);
	}